

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CpuBackend.cpp
# Opt level: O0

void __thiscall xmrig::CpuBackend::stop(CpuBackend *this)

{
  undefined *puVar1;
  bool bVar2;
  uint64_t uVar3;
  uint64_t uVar4;
  Workers<xmrig::CpuLaunchData> *in_stack_00000010;
  uint64_t ts;
  vector<xmrig::CpuLaunchData,_std::allocator<xmrig::CpuLaunchData>_> *in_stack_fffffffffffffff0;
  
  bVar2 = std::vector<xmrig::CpuLaunchData,_std::allocator<xmrig::CpuLaunchData>_>::empty
                    (in_stack_fffffffffffffff0);
  if (!bVar2) {
    uVar3 = Chrono::steadyMSecs();
    Workers<xmrig::CpuLaunchData>::stop(in_stack_00000010);
    std::vector<xmrig::CpuLaunchData,_std::allocator<xmrig::CpuLaunchData>_>::clear
              ((vector<xmrig::CpuLaunchData,_std::allocator<xmrig::CpuLaunchData>_> *)0x1fecb9);
    puVar1 = tag;
    uVar4 = Chrono::steadyMSecs();
    Log::print(INFO,"%s\x1b[0;33m stopped\x1b[0m\x1b[1;30m (%lu ms)\x1b[0m",puVar1,uVar4 - uVar3);
  }
  return;
}

Assistant:

void xmrig::CpuBackend::stop()
{
    if (d_ptr->threads.empty()) {
        return;
    }

    const uint64_t ts = Chrono::steadyMSecs();

    d_ptr->workers.stop();
    d_ptr->threads.clear();

    LOG_INFO("%s" YELLOW(" stopped") BLACK_BOLD(" (%" PRIu64 " ms)"), tag, Chrono::steadyMSecs() - ts);
}